

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O3

nsync_note __thiscall nsync::nsync_note_new(nsync *this,nsync_note parent,nsync_time abs_deadline)

{
  __time_t _Var1;
  __syscall_slong_t _Var2;
  int iVar3;
  nsync_note n;
  nsync_dll_list_ pnVar4;
  nsync_time *pnVar5;
  nsync_time b;
  nsync_time nVar6;
  
  n = (nsync_note)calloc(1,0x70);
  if (n != (nsync_note)0x0) {
    nsync_dll_init_((nsync_dll_element_ *)n,n);
    (n->expiry_time).tv_sec = (__time_t)parent;
    (n->expiry_time).tv_nsec = abs_deadline.tv_sec;
    n->expiry_time_valid = 1;
    nVar6 = nsync_note_notified_deadline_(n);
    pnVar5 = (nsync_time *)&nsync_time_zero;
    iVar3 = nsync_time_cmp(nVar6,(nsync_time)ZEXT816(0));
    if ((this != (nsync *)0x0) && (0 < iVar3)) {
      nsync_mu_lock((nsync_mu *)(this + 0x30));
      if (*(int *)(this + 0x54) == 0) {
        if (*(int *)(this + 0x18) == 0) {
          pnVar5 = (nsync_time *)&nsync_time_no_deadline;
        }
        else {
          pnVar5 = (nsync_time *)(this + 0x20);
        }
      }
      _Var1 = pnVar5->tv_sec;
      _Var2 = pnVar5->tv_nsec;
      nVar6 = *pnVar5;
      b.tv_nsec = abs_deadline.tv_sec;
      b.tv_sec = (__time_t)parent;
      iVar3 = nsync_time_cmp(*pnVar5,b);
      if (iVar3 < 0) {
        (n->expiry_time).tv_sec = _Var1;
        (n->expiry_time).tv_nsec = _Var2;
        n->expiry_time_valid = 1;
      }
      iVar3 = nsync_time_cmp(nVar6,(nsync_time)ZEXT816(0));
      if (0 < iVar3) {
        n->parent = (nsync_note_s_ *)this;
        pnVar4 = nsync_dll_make_last_in_list_
                           (*(nsync_dll_list_ *)(this + 0x60),(nsync_dll_element_ *)n);
        *(nsync_dll_list_ *)(this + 0x60) = pnVar4;
      }
      nsync_mu_unlock((nsync_mu *)(this + 0x30));
    }
  }
  return n;
}

Assistant:

nsync_note nsync_note_new (nsync_note parent,
			   nsync_time abs_deadline) {
	nsync_note n = (nsync_note) malloc (sizeof (*n));
	if (n != NULL) {
		memset ((void *) n, 0, sizeof (*n));
		nsync_dll_init_ (&n->parent_child_link, n);
		set_expiry_time (n, abs_deadline);
		if (!nsync_note_is_notified (n) && parent != NULL) {
			nsync_time parent_time;
			nsync_mu_lock (&parent->note_mu);
			parent_time = NOTIFIED_TIME (parent);
			if (nsync_time_cmp (parent_time, abs_deadline) < 0) {
				set_expiry_time (n, parent_time);
			}
			if (nsync_time_cmp (parent_time, nsync_time_zero) > 0) {
				n->parent = parent;
				parent->children = nsync_dll_make_last_in_list_ (parent->children,
					&n->parent_child_link);
			}
			nsync_mu_unlock (&parent->note_mu);
		}
	}
	return (n);
}